

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisketch.cpp
# Opt level: O2

minisketch * minisketch_create(uint32_t bits,uint32_t implementation,size_t capacity)

{
  long lVar1;
  Sketch *pSVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = anon_unknown.dwarf_2e736d4::Construct(bits,implementation);
  if (pSVar2 == (Sketch *)0x0) {
    pSVar2 = (Sketch *)0x0;
  }
  else {
    (*pSVar2->_vptr_Sketch[3])(pSVar2,capacity);
    pSVar2->m_canary = 0x6d496e536b65;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (minisketch *)pSVar2;
  }
  __stack_chk_fail();
}

Assistant:

minisketch* minisketch_create(uint32_t bits, uint32_t implementation, size_t capacity) {
    try {
        Sketch* sketch = Construct(bits, implementation);
        if (sketch) {
            try {
                sketch->Init(capacity);
            } catch (const std::bad_alloc&) {
                delete sketch;
                throw;
            }
            sketch->Ready();
        }
        return (minisketch*)sketch;
    } catch (const std::bad_alloc&) {
        return nullptr;
    }
}